

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDFacePtr __thiscall
ON_SubDEdge::NeighborFacePtr(ON_SubDEdge *this,ON_SubDFace *face,bool bStopAtCrease)

{
  ulong uVar1;
  ulong uVar2;
  ON_SubDFace *pOVar3;
  ON_SubDFace *pOVar4;
  
  if (((face != (ON_SubDFace *)0x0) && (this->m_face_count == 2)) &&
     ((!bStopAtCrease || (this->m_edge_tag != Crease)))) {
    uVar1 = this->m_face2[0].m_ptr;
    uVar2 = this->m_face2[1].m_ptr;
    pOVar4 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
    pOVar3 = (ON_SubDFace *)(uVar2 & 0xfffffffffffffff8);
    if (pOVar3 != (ON_SubDFace *)0x0 && pOVar4 != (ON_SubDFace *)0x0) {
      if (pOVar4 == face) {
        if (pOVar3 != face) {
          return (ON_SubDFacePtr)uVar2;
        }
      }
      else if (pOVar3 == face) {
        return (ON_SubDFacePtr)uVar1;
      }
    }
    ON_SubDIncrementErrorCount();
  }
  return (ON_SubDFacePtr)0;
}

Assistant:

const ON_SubDFacePtr ON_SubDEdge::NeighborFacePtr(
  const ON_SubDFace* face,
    bool bStopAtCrease
  ) const
{
  if ( nullptr == face || 2 != m_face_count )
    return ON_SubDFacePtr::Null;
  // Do not stop at x tags
  if (bStopAtCrease && ON_SubDEdgeTag::Crease == m_edge_tag)
    return ON_SubDFacePtr::Null;
  const ON_SubDFace* f[2] = { ON_SUBD_FACE_POINTER(m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(m_face2[1].m_ptr) };
  if (nullptr == f[0] || nullptr == f[1] )
    return ON_SUBD_RETURN_ERROR(ON_SubDFacePtr::Null);
  if (face == f[0])
  {
    if (face == f[1] )
      return ON_SUBD_RETURN_ERROR(ON_SubDFacePtr::Null);
    return m_face2[1];
  }
  if (face == f[1])
  {
    return m_face2[0];
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDFacePtr::Null);
}